

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

int __thiscall
glslang::HlslParseContext::findSubtreeOffset(HlslParseContext *this,TIntermNode *node)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  TType *type;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long *plVar5;
  
  iVar4 = (*node->_vptr_TIntermNode[0x18])(node);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if ((plVar5 != (long *)0x0) &&
     (((cVar3 = (**(code **)(*plVar5 + 0x150))(plVar5), cVar3 != '\0' ||
       (cVar3 = (**(code **)(*plVar5 + 0x168))(plVar5), cVar3 != '\0')) &&
      (lVar2 = plVar5[0x18], (int)lVar2 != -1)))) {
    lVar6 = (**(code **)(*plVar5 + 0x180))(plVar5);
    p_Var1 = &(this->flattenMap).
              super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->flattenMap).
             super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < lVar6]) {
      if (lVar6 <= *(long *)(p_Var8 + 1)) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var8 = p_Var7, lVar6 < *(long *)(p_Var7 + 1))) {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      type = (TType *)(**(code **)(*plVar5 + 0xf0))(plVar5);
      iVar4 = findSubtreeOffset(this,type,(int)lVar2,(TVector<int> *)&p_Var8[2]._M_parent);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

int HlslParseContext::findSubtreeOffset(const TIntermNode& node) const
{
    const TIntermSymbol* sym = node.getAsSymbolNode();
    if (sym == nullptr)
        return 0;
    if (!sym->isArray() && !sym->isStruct())
        return 0;
    int subset = sym->getFlattenSubset();
    if (subset == -1)
        return 0;

    // Getting this far means a partial aggregate is identified by the flatten subset.
    // Find the first leaf of the subset.

    const auto flattenData = flattenMap.find(sym->getId());
    if (flattenData == flattenMap.end())
        return 0;

    return findSubtreeOffset(sym->getType(), subset, flattenData->second.offsets);

    do {
        subset = flattenData->second.offsets[subset];
    } while (true);
}